

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

MidiEvent * __thiscall
smf::MidiFile::addPitchBend(MidiFile *this,int aTrack,int aTick,int aChannel,double amount)

{
  value_type vVar1;
  byte *pbVar2;
  reference pvVar3;
  MidiEvent *pMVar4;
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> mididata;
  byte local_30;
  int msbint;
  int lsbint;
  int value;
  double amount_local;
  int aChannel_local;
  int aTick_local;
  int aTrack_local;
  MidiFile *this_local;
  
  this->m_timemapvalid = false;
  msbint = (int)((amount + 1.0) * 8192.0 + 0.5);
  if (0x3fff < msbint) {
    msbint = 0x3fff;
  }
  if (msbint < 0) {
    msbint = 0;
  }
  local_30 = (byte)msbint & 0x7f;
  mididata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)msbint >> 7 & 0x7f;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,3);
  if (aChannel < 0) {
    amount_local._4_1_ = 0;
  }
  else {
    amount_local._4_4_ = aChannel;
    if (0xf < aChannel) {
      amount_local._4_4_ = 0xf;
    }
  }
  pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,0);
  *pbVar2 = amount_local._4_1_ | 0xe0;
  pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,1);
  *pbVar2 = local_30;
  vVar1 = mididata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_1_;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,2);
  *pvVar3 = vVar1;
  pMVar4 = addEvent(this,aTrack,aTick,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  return pMVar4;
}

Assistant:

MidiEvent* MidiFile::addPitchBend(int aTrack, int aTick, int aChannel, double amount) {
	m_timemapvalid = 0;
	amount += 1.0;
	int value = int(amount * 8192 + 0.5);

	// prevent any wrap-around in case of round-off errors
	if (value > 0x3fff) {
		value = 0x3fff;
	}
	if (value < 0) {
		value = 0;
	}

	int lsbint = 0x7f & value;
	int msbint = 0x7f & (value  >> 7);

	std::vector<uchar> mididata;
	mididata.resize(3);
	if (aChannel < 0) {
		aChannel = 0;
	} else if (aChannel > 15) {
		aChannel = 15;
	}
	mididata[0] = uchar(0xe0 | aChannel);
	mididata[1] = uchar(lsbint);
	mididata[2] = uchar(msbint);

	return addEvent(aTrack, aTick, mididata);
}